

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface_p.h
# Opt level: O2

void __thiscall QFutureInterfaceBasePrivate::Data::setException(Data *this,exception_ptr *e)

{
  long in_FS_OFFSET;
  exception_ptr eStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::ResultStoreBase::~ResultStoreBase((ResultStoreBase *)this);
  *(undefined8 *)this = 0;
  std::__exception_ptr::exception_ptr::exception_ptr(&eStack_28,e);
  QtPrivate::ExceptionStore::setException((ExceptionStore *)this,(exception_ptr)&eStack_28);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setException(const std::exception_ptr &e)
        {
            m_results.~ResultStoreBase();
            new (&m_exceptionStore) QtPrivate::ExceptionStore();
            m_exceptionStore.setException(e);
        }